

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

bool duckdb::LikeEscapeOperator::Operation<duckdb::string_t,duckdb::string_t,duckdb::string_t>
               (string_t str,string_t pattern,string_t escape)

{
  char escape_00;
  bool bVar1;
  char *pdata;
  char *sdata;
  string_t escape_01;
  undefined8 local_20;
  char *local_18;
  undefined8 local_10;
  char *local_8;
  
  local_18 = pattern.value._8_8_;
  escape_01.value._8_8_ = pattern.value._0_8_;
  local_8 = str.value._8_8_;
  local_10 = str.value._0_8_;
  escape_01.value._0_8_ = escape.value._8_8_;
  local_20 = escape_01.value._8_8_;
  escape_00 = GetEscapeChar(escape.value._0_8_,escape_01);
  sdata = local_8;
  if ((local_10 & 0xffffffff) < 0xd) {
    sdata = (char *)((long)&local_10 + 4);
  }
  pdata = local_18;
  if ((local_20 & 0xffffffff) < 0xd) {
    pdata = (char *)((long)&local_20 + 4);
  }
  bVar1 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                    (sdata,local_10 & 0xffffffff,pdata,local_20 & 0xffffffff,escape_00);
  return bVar1;
}

Assistant:

static inline bool Operation(TA str, TB pattern, TC escape) {
		char escape_char = GetEscapeChar(escape);
		return LikeOperatorFunction(str.GetData(), str.GetSize(), pattern.GetData(), pattern.GetSize(), escape_char);
	}